

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::GetFullCovariance
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *full_covariance)

{
  double dVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  int j;
  int column;
  long lVar6;
  int iVar7;
  int i;
  long lVar8;
  int iVar9;
  vector<double,_std::allocator<double>_> mean;
  long local_80;
  Row local_70;
  double local_58;
  double local_50;
  Row local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (this->num_statistics_order_ < 2) {
    return false;
  }
  if ((this->diagonal_ == false) &&
     (iVar4 = buffer->zeroth_order_statistics_,
     full_covariance != (SymmetricMatrix *)0x0 && 0 < iVar4)) {
    iVar7 = this->num_order_ + 1;
    if (full_covariance->num_dimension_ != iVar7) {
      SymmetricMatrix::Resize(full_covariance,iVar7);
      iVar4 = buffer->zeroth_order_statistics_;
    }
    if (this->numerically_stable_ == true) {
      iVar7 = 1;
      for (iVar9 = 0; iVar9 <= this->num_order_; iVar9 = iVar9 + 1) {
        for (column = 0; iVar7 != column; column = column + 1) {
          mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&PTR__Row_00110d30;
          mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)CONCAT44(mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_,iVar9);
          mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)&buffer->second_order_statistics_;
          pdVar5 = SymmetricMatrix::Row::operator[]((Row *)&mean,column);
          dVar1 = *pdVar5;
          local_70._vptr_Row = (_func_int **)&PTR__Row_00110d30;
          local_70.matrix_ = full_covariance;
          local_70.row_ = iVar9;
          pdVar5 = SymmetricMatrix::Row::operator[](&local_70,column);
          *pdVar5 = dVar1 * (1.0 / (double)iVar4);
        }
        iVar7 = iVar7 + 1;
      }
    }
    else {
      mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar3 = GetMean(this,buffer,&mean);
      pdVar2 = mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (!bVar3) {
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&mean.super__Vector_base<double,_std::allocator<double>_>);
        goto LAB_00103e3b;
      }
      local_80 = 1;
      for (lVar8 = 0; lVar8 <= this->num_order_; lVar8 = lVar8 + 1) {
        for (lVar6 = 0; local_80 != lVar6; lVar6 = lVar6 + 1) {
          local_70._vptr_Row = (_func_int **)&PTR__Row_00110d30;
          local_70.matrix_ = &buffer->second_order_statistics_;
          local_70.row_ = (int)lVar8;
          pdVar5 = SymmetricMatrix::Row::operator[](&local_70,(int)lVar6);
          dVar1 = *pdVar5;
          local_58 = pdVar2[lVar8];
          local_50 = pdVar2[lVar6];
          local_48._vptr_Row = (_func_int **)&PTR__Row_00110d30;
          local_48.matrix_ = full_covariance;
          local_48.row_ = (int)lVar8;
          pdVar5 = SymmetricMatrix::Row::operator[](&local_48,(int)lVar6);
          *pdVar5 = dVar1 * (1.0 / (double)iVar4) - local_50 * local_58;
        }
        local_80 = local_80 + 1;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&mean.super__Vector_base<double,_std::allocator<double>_>);
    }
    bVar3 = true;
  }
  else {
LAB_00103e3b:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool StatisticsAccumulation::GetFullCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* full_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == full_covariance) {
    return false;
  }

  if (full_covariance->GetNumDimension() != num_order_ + 1) {
    full_covariance->Resize(num_order_ + 1);
  }

  const double z(1.0 / buffer.zeroth_order_statistics_);

  if (numerically_stable_) {
    for (int i(0); i <= num_order_; ++i) {
      for (int j(0); j <= i; ++j) {
        (*full_covariance)[i][j] = z * buffer.second_order_statistics_[i][j];
      }
    }
  } else {
    std::vector<double> mean;
    if (!GetMean(buffer, &mean)) {
      return false;
    }
    const double* mu(&(mean[0]));
    for (int i(0); i <= num_order_; ++i) {
      for (int j(0); j <= i; ++j) {
        (*full_covariance)[i][j] =
            z * buffer.second_order_statistics_[i][j] - mu[i] * mu[j];
      }
    }
  }

  return true;
}